

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::E_formatter<spdlog::details::null_scoped_padder>::format
          (E_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  unsigned_long_long uVar2;
  char *pcVar3;
  unsigned_long_long value;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  char acStack_23 [3];
  char *local_20;
  
  lVar1 = (msg->time).__d.__r;
  uVar2 = lVar1 / 1000000000;
  value = -uVar2;
  if (0 < (long)uVar2) {
    value = uVar2;
  }
  pcVar3 = fmt::v6::format_int::format_decimal((format_int *)&stack0xffffffffffffffc8,value);
  local_20 = pcVar3;
  if (lVar1 < -999999999) {
    local_20 = pcVar3 + -1;
    pcVar3[-1] = '-';
  }
  if (-0x16 < (long)(&stack0xffffffffffffffc8 + -(long)local_20)) {
    fmt::v6::internal::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_20,
               local_20 + (long)(&stack0xffffffffffffffc8 + -(long)local_20 + 0x15));
    return;
  }
  fmt::v6::internal::assert_fail(in_stack_ffffffffffffffd0,0,in_stack_ffffffffffffffc8);
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);
        auto duration = msg.time.time_since_epoch();
        auto seconds = std::chrono::duration_cast<std::chrono::seconds>(duration).count();
        fmt_helper::append_int(seconds, dest);
    }